

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O1

int compare_sad(void *a,void *b)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*(int *)((long)b + 4) <= *(int *)((long)a + 4)) {
    uVar1 = (uint)(*(int *)((long)a + 4) != *(int *)((long)b + 4));
  }
  return uVar1;
}

Assistant:

static int compare_sad(const void *a, const void *b) {
  const int diff = ((center_mv_t *)a)->sad - ((center_mv_t *)b)->sad;
  if (diff < 0)
    return -1;
  else if (diff > 0)
    return 1;
  return 0;
}